

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O2

bool duckdb_re2::RE2::Replace(string *str,RE2 *re,StringPiece *rewrite)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  string s;
  StringPiece vec [17];
  string local_158;
  StringPiece local_138 [17];
  
  switchD_014c3389::default(local_138,0,0x110);
  uVar3 = MaxSubmatch(rewrite);
  bVar2 = false;
  if ((uVar3 < 0x11) && (bVar2 = false, (int)uVar3 <= re->num_captures_)) {
    local_158._M_dataplus._M_p = (str->_M_dataplus)._M_p;
    local_158._M_string_length = str->_M_string_length;
    bVar2 = false;
    bVar1 = Match(re,(StringPiece *)&local_158,0,local_158._M_string_length,UNANCHORED,local_138,
                  uVar3 + 1);
    if (bVar1) {
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      local_158._M_string_length = 0;
      local_158.field_2._M_local_buf[0] = '\0';
      bVar2 = Rewrite(re,&local_158,rewrite,local_138,uVar3 + 1);
      if (bVar2) {
        std::__cxx11::string::replace
                  ((ulong)str,(long)local_138[0].data_ - (long)(str->_M_dataplus)._M_p,
                   (string *)local_138[0].size_);
      }
      std::__cxx11::string::~string((string *)&local_158);
    }
  }
  return bVar2;
}

Assistant:

bool RE2::Replace(std::string* str,
                  const RE2& re,
                  const StringPiece& rewrite) {
  StringPiece vec[kVecSize];
  int nvec = 1 + MaxSubmatch(rewrite);
  if (nvec > 1 + re.NumberOfCapturingGroups())
    return false;
  if (nvec > static_cast<int>(arraysize(vec)))
    return false;
  if (!re.Match(*str, 0, str->size(), UNANCHORED, vec, nvec))
    return false;

  std::string s;
  if (!re.Rewrite(&s, rewrite, vec, nvec))
    return false;

  assert(vec[0].data() >= str->data());
  assert(vec[0].data() + vec[0].size() <= str->data() + str->size());
  str->replace(vec[0].data() - str->data(), vec[0].size(), s);
  return true;
}